

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

void stb_arith_encode(stb_arith *a,uint totalfreq,uint freq,uint cumfreq)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = a->range_low;
  uVar2 = (a->range_high - uVar1) / totalfreq;
  uVar4 = cumfreq * uVar2;
  uVar5 = uVar4 + uVar1;
  a->range_low = uVar5;
  uVar2 = uVar5 + freq * uVar2;
  a->range_high = uVar2;
  if (CARRY4(uVar4,uVar1)) {
    stb__arith_carry(a);
    uVar5 = a->range_low;
    uVar2 = a->range_high;
  }
  for (uVar2 = uVar2 - uVar5; uVar2 < 0x1000000; uVar2 = iVar3 + uVar2 * -0x100) {
    stb__arith_putbyte(a,uVar5 >> 0x18);
    uVar2 = a->range_low;
    uVar5 = uVar2 * 0x100;
    a->range_low = uVar5;
    iVar3 = a->range_high * 0x100;
    a->range_high = iVar3 + 0xff;
  }
  return;
}

Assistant:

void stb_arith_encode(stb_arith *a, unsigned int totalfreq, unsigned int freq, unsigned int cumfreq)
{
   unsigned int range = a->range_high - a->range_low;
   unsigned int old = a->range_low;
   range /= totalfreq;
   a->range_low += range * cumfreq;
   a->range_high = a->range_low + range*freq;
   if (a->range_low < old)
      stb__arith_carry(a);
   while (a->range_high - a->range_low < 0x1000000)
      stb__renorm_encoder(a);
}